

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMPTEAnalyzerResults.cpp
# Opt level: O3

void __thiscall
SMPTEAnalyzerResults::GenerateBubbleText
          (SMPTEAnalyzerResults *this,U64 frame_index,Channel *channel,DisplayBase display_base)

{
  Frame frame;
  Frame aFStack_58 [40];
  Frame local_30 [40];
  
  AnalyzerResults::GetFrame((ulonglong)local_30);
  AnalyzerResults::ClearResultStrings();
  Frame::Frame(aFStack_58,local_30);
  fillSMPTE(this,aFStack_58,(char *)0x0);
  Frame::~Frame(aFStack_58);
  Frame::~Frame(local_30);
  return;
}

Assistant:

void SMPTEAnalyzerResults::GenerateBubbleText( U64 frame_index, Channel& channel, DisplayBase display_base )
{
	Frame frame = GetFrame( frame_index );

	ClearResultStrings();
	fillSMPTE(frame,NULL);
}